

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char16_t,std::char_traits<char16_t>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
          (pair<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                end,char16_t in_whitespace)

{
  jessilib *pjVar1;
  long lVar2;
  char16_t cVar3;
  long lVar4;
  size_t sVar5;
  
  cVar3 = (char16_t)end._M_current;
  if (begin._M_current <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char16_t *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char16_t *)0x0;
    return __return_storage_ptr__;
  }
  do {
    if (*(char16_t *)this != cVar3) break;
    this = this + 2;
  } while (this != (jessilib *)begin._M_current);
  if (this != (jessilib *)begin._M_current) {
    lVar4 = 0;
    do {
      if (*(char16_t *)(this + lVar4) == cVar3) {
        sVar5 = lVar4 >> 1;
        goto LAB_0040b902;
      }
      lVar2 = lVar4 + 2;
      lVar4 = lVar4 + 2;
    } while (this + lVar2 != (jessilib *)begin._M_current);
  }
  (__return_storage_ptr__->first)._M_len = (long)begin._M_current - (long)this >> 1;
  (__return_storage_ptr__->first)._M_str = (char16_t *)this;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char16_t *)0x0;
  return __return_storage_ptr__;
  while (*(char16_t *)pjVar1 == cVar3) {
LAB_0040b902:
    lVar4 = lVar4 + 2;
    pjVar1 = this + lVar4;
    if (pjVar1 == (jessilib *)begin._M_current) break;
  }
  (__return_storage_ptr__->first)._M_len = sVar5;
  (__return_storage_ptr__->first)._M_str = (char16_t *)this;
  (__return_storage_ptr__->second)._M_len = (long)begin._M_current + (-lVar4 - (long)this) >> 1;
  (__return_storage_ptr__->second)._M_str = (char16_t *)pjVar1;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}